

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::EnhancedLayouts::XFBCaptureStructTest::verifyBuffers
          (XFBCaptureStructTest *this,bufferCollection *buffers)

{
  ostringstream *this_00;
  pointer ppVar1;
  Buffer *this_01;
  bufferDescriptor *pbVar2;
  int *piVar3;
  int *piVar4;
  GLchar *pGVar5;
  MessageBuilder *this_02;
  int iVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 local_1a0 [384];
  
  ppVar1 = (buffers->m_vector).
           super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_01 = ppVar1[1].m_buffer;
  pbVar2 = ppVar1[1].m_descriptor;
  Utils::Buffer::Bind(this_01);
  piVar4 = (int *)Utils::Buffer::Map(this_01,ReadOnly);
  piVar3 = *(int **)&(pbVar2->m_expected_data).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  auVar8[0] = -((char)piVar3[0xc] == (char)piVar4[0xc]);
  auVar8[1] = -(*(char *)((long)piVar3 + 0x31) == *(char *)((long)piVar4 + 0x31));
  auVar8[2] = -(*(char *)((long)piVar3 + 0x32) == *(char *)((long)piVar4 + 0x32));
  auVar8[3] = -(*(char *)((long)piVar3 + 0x33) == *(char *)((long)piVar4 + 0x33));
  auVar8[4] = -((char)piVar3[0xd] == (char)piVar4[0xd]);
  auVar8[5] = -(*(char *)((long)piVar3 + 0x35) == *(char *)((long)piVar4 + 0x35));
  auVar8[6] = -(*(char *)((long)piVar3 + 0x36) == *(char *)((long)piVar4 + 0x36));
  auVar8[7] = -(*(char *)((long)piVar3 + 0x37) == *(char *)((long)piVar4 + 0x37));
  auVar8[8] = -((char)piVar3[0xe] == (char)piVar4[0xe]);
  auVar8[9] = -(*(char *)((long)piVar3 + 0x39) == *(char *)((long)piVar4 + 0x39));
  auVar8[10] = -(*(char *)((long)piVar3 + 0x3a) == *(char *)((long)piVar4 + 0x3a));
  auVar8[0xb] = -(*(char *)((long)piVar3 + 0x3b) == *(char *)((long)piVar4 + 0x3b));
  auVar8[0xc] = -((char)piVar3[0xf] == (char)piVar4[0xf]);
  auVar8[0xd] = -(*(char *)((long)piVar3 + 0x3d) == *(char *)((long)piVar4 + 0x3d));
  auVar8[0xe] = -(*(char *)((long)piVar3 + 0x3e) == *(char *)((long)piVar4 + 0x3e));
  auVar8[0xf] = -(*(char *)((long)piVar3 + 0x3f) == *(char *)((long)piVar4 + 0x3f));
  bVar7 = (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(auVar8[0xf] >> 7) << 0xf
                  ) == 0xffff;
  auVar9._0_4_ = -(uint)(piVar3[4] == piVar4[4] && *piVar3 == *piVar4);
  auVar9._4_4_ = -(uint)(piVar3[5] == piVar4[5] && piVar3[1] == piVar4[1]);
  auVar9._8_4_ = -(uint)(piVar3[6] == piVar4[6] && piVar3[2] == piVar4[2]);
  auVar9._12_4_ = -(uint)(piVar3[7] == piVar4[7] && piVar3[3] == piVar4[3]);
  iVar6 = movmskps((int)piVar3,auVar9);
  if (iVar6 != 0xf || !bVar7) {
    local_1a0._0_8_ =
         ((this->super_BufferTestBase).super_TestBase.super_TestCase.m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Invalid result. Buffer: ");
    pGVar5 = Utils::Buffer::GetBufferName(pbVar2->m_target);
    std::operator<<((ostream *)this_00,pGVar5);
    std::operator<<((ostream *)this_00,". Index: ");
    this_02 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1a0,&pbVar2->m_index);
    tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  Utils::Buffer::UnMap(this_01);
  return iVar6 == 0xf && bVar7;
}

Assistant:

bool XFBCaptureStructTest::verifyBuffers(bufferCollection& buffers)
{
	bool result = true;

	bufferCollection::pair& pair	   = buffers.m_vector[1] /* xfb */;
	Utils::Buffer*			buffer	 = pair.m_buffer;
	bufferDescriptor*		descriptor = pair.m_descriptor;

	/* Get pointer to contents of buffer */
	buffer->Bind();
	GLubyte* buffer_data = (GLubyte*)buffer->Map(Utils::Buffer::ReadOnly);

	/* Get pointer to expected data */
	GLubyte* expected_data = (GLubyte*)&descriptor->m_expected_data[0];

	/* Compare */
	static const GLuint vec4_size = 16;

	int res_before = memcmp(buffer_data, expected_data, vec4_size);
	int res_gohan  = memcmp(buffer_data + 1 * vec4_size, expected_data + 1 * vec4_size, vec4_size);
	int res_chichi = memcmp(buffer_data + 3 * vec4_size, expected_data + 3 * vec4_size, vec4_size);

	if ((0 != res_before) || (0 != res_gohan) || (0 != res_chichi))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Invalid result. Buffer: " << Utils::Buffer::GetBufferName(descriptor->m_target)
			<< ". Index: " << descriptor->m_index << tcu::TestLog::EndMessage;

		result = false;
	}

	/* Release buffer mapping */
	buffer->UnMap();

	return result;
}